

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynClassStaticIf * ParseClassStaticIf(ParseContext *ctx,bool nested)

{
  Lexeme *begin;
  int iVar1;
  Lexeme *pLVar2;
  SynBase *this;
  undefined4 extraout_var;
  SynClassElements *pSVar3;
  SynClassStaticIf *pSVar4;
  undefined4 extraout_var_00;
  SynClassElements *this_00;
  undefined4 extraout_var_01;
  Lexeme *pos;
  undefined7 in_register_00000031;
  IntrusiveList<SynClassStaticIf> staticIfs;
  IntrusiveList<SynClassStaticIf> local_58;
  SynClassStaticIf *local_48;
  SynClassStaticIf *pSStack_40;
  
  begin = ctx->currentLexeme;
  pLVar2 = begin;
  if ((int)CONCAT71(in_register_00000031,nested) == 0) {
    if (begin->type != lex_at) {
      return (SynClassStaticIf *)0x0;
    }
    pLVar2 = begin + 1;
  }
  if (pLVar2->type != lex_if) {
    return (SynClassStaticIf *)0x0;
  }
  ctx->currentLexeme = pLVar2 + 1;
  anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
  this = ParseAssignment(ctx);
  if (this == (SynBase *)0x0) {
    anon_unknown.dwarf_151f2::Report
              (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (SynBase *)CONCAT44(extraout_var,iVar1);
    SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
  }
  anon_unknown.dwarf_151f2::CheckConsume
            (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
  if (ctx->currentLexeme->type == lex_ofigure) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    pSVar3 = ParseClassElements(ctx);
    anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
  }
  else {
    pSVar3 = ParseClassElements(ctx);
  }
  pLVar2 = ctx->currentLexeme;
  if (pLVar2->type == lex_else) {
    ctx->currentLexeme = pLVar2 + 1;
    if (pLVar2[1].type == lex_ofigure) {
      ctx->currentLexeme = pLVar2 + 2;
      this_00 = ParseClassElements(ctx);
      anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    }
    else if (pLVar2[1].type == lex_if) {
      local_58.head = (SynClassStaticIf *)0x0;
      local_58.tail = (SynClassStaticIf *)0x0;
      pSVar4 = ParseClassStaticIf(ctx,true);
      IntrusiveList<SynClassStaticIf>::push_back(&local_58,pSVar4);
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
      this_00 = (SynClassElements *)CONCAT44(extraout_var_00,iVar1);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011731f;
      local_48 = local_58.head;
      pSStack_40 = local_58.tail;
      SynBase::SynBase((SynBase *)this_00,0x3e,pLVar2 + 1,ctx->currentLexeme + -1);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f898;
      (this_00->typedefs).head = (SynTypedef *)0x0;
      (this_00->typedefs).tail = (SynTypedef *)0x0;
      (this_00->functions).head = (SynFunctionDefinition *)0x0;
      (this_00->functions).tail = (SynFunctionDefinition *)0x0;
      (this_00->accessors).head = (SynAccessor *)0x0;
      (this_00->accessors).tail = (SynAccessor *)0x0;
      (this_00->members).head = (SynVariableDefinitions *)0x0;
      (this_00->members).tail = (SynVariableDefinitions *)0x0;
      (this_00->constantSets).head = (SynConstantSet *)0x0;
      (this_00->constantSets).tail = (SynConstantSet *)0x0;
      (this_00->staticIfs).head = local_48;
      (this_00->staticIfs).tail = pSStack_40;
    }
    else {
      this_00 = ParseClassElements(ctx);
    }
  }
  else {
    this_00 = (SynClassElements *)0x0;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  pSVar4 = (SynClassStaticIf *)CONCAT44(extraout_var_01,iVar1);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)pSVar4,0x3d,begin,ctx->currentLexeme + -1);
    (pSVar4->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fdd8;
    pSVar4->condition = this;
    pSVar4->trueBlock = pSVar3;
    pSVar4->falseBlock = this_00;
    return pSVar4;
  }
LAB_0011731f:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynClassStaticIf* ParseClassStaticIf(ParseContext &ctx, bool nested)
{
	Lexeme *start = ctx.currentLexeme;

	if(nested || ctx.Consume(lex_at))
	{
		if(!ctx.Consume(lex_if))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		bool hasBlock = ctx.Consume(lex_ofigure);

		SynClassElements *trueBlock = ParseClassElements(ctx);

		if(hasBlock)
			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		SynClassElements *falseBlock = NULL;

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
			{
				Lexeme *pos = ctx.currentLexeme;

				IntrusiveList<SynClassStaticIf> staticIfs;

				staticIfs.push_back(ParseClassStaticIf(ctx, true));

				falseBlock = new (ctx.get<SynClassElements>()) SynClassElements(pos, ctx.Previous(), IntrusiveList<SynTypedef>(), IntrusiveList<SynFunctionDefinition>(), IntrusiveList<SynAccessor>(), IntrusiveList<SynVariableDefinitions>(), IntrusiveList<SynConstantSet>(), staticIfs);
			}
			else
			{
				hasBlock = ctx.Consume(lex_ofigure);

				falseBlock = ParseClassElements(ctx);

				if(hasBlock)
					CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
			}
		}

		return new (ctx.get<SynClassStaticIf>()) SynClassStaticIf(start, ctx.Previous(), condition, trueBlock, falseBlock);
	}

	return NULL;
}